

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ulist.cpp
# Opt level: O1

void ulist_addItemEndList_63(UList *list,void *data,UBool forceDelete,UErrorCode *status)

{
  int iVar1;
  UListNode *pUVar2;
  UListNode *pUVar3;
  
  if (((data == (void *)0x0) || (list == (UList *)0x0)) || (U_ZERO_ERROR < *status)) {
    if (forceDelete != '\0') {
      uprv_free_63(data);
      return;
    }
  }
  else {
    pUVar3 = (UListNode *)uprv_malloc_63(0x20);
    if (pUVar3 == (UListNode *)0x0) {
      if (forceDelete != '\0') {
        uprv_free_63(data);
      }
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      pUVar3->data = data;
      pUVar3->forceDelete = forceDelete;
      iVar1 = list->size;
      if (iVar1 == 0) {
        pUVar3->next = (UListNode *)0x0;
        pUVar3->previous = (UListNode *)0x0;
        list->head = pUVar3;
      }
      else {
        pUVar3->next = (UListNode *)0x0;
        pUVar2 = list->tail;
        pUVar3->previous = pUVar2;
        pUVar2->next = pUVar3;
      }
      list->tail = pUVar3;
      list->size = iVar1 + 1;
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2 ulist_addItemEndList(UList *list, const void *data, UBool forceDelete, UErrorCode *status) {
    UListNode *newItem = NULL;
    
    if (U_FAILURE(*status) || list == NULL || data == NULL) {
        if (forceDelete) {
            uprv_free((void *)data);
        }
        return;
    }
    
    newItem = (UListNode *)uprv_malloc(sizeof(UListNode));
    if (newItem == NULL) {
        if (forceDelete) {
            uprv_free((void *)data);
        }
        *status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    newItem->data = (void *)(data);
    newItem->forceDelete = forceDelete;
    
    if (list->size == 0) {
        ulist_addFirstItem(list, newItem);
    } else {
        newItem->next = NULL;
        newItem->previous = list->tail;
        list->tail->next = newItem;
        list->tail = newItem;
    }
    
    list->size++;
}